

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O3

void __thiscall aeron::archive::Configuration::Configuration(Configuration *this)

{
  type_info_t ***ppptVar1;
  bool bVar2;
  undefined1 uVar3;
  int32_t iVar4;
  type_info_t **pptVar5;
  size_t sVar6;
  type_info_t *ptVar7;
  char *pcVar8;
  size_type __dnew;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> result;
  type_info_t *local_88;
  bad_lexical_cast local_80;
  undefined1 local_68;
  undefined1 local_67;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  string *local_48;
  string *local_40;
  string *local_38;
  
  local_38 = (string *)&this->controlChannel;
  local_50 = &(this->controlChannel).field_2;
  (this->controlChannel)._M_dataplus._M_p = (pointer)local_50;
  (this->controlChannel)._M_string_length = 0;
  (this->controlChannel).field_2._M_local_buf[0] = '\0';
  local_40 = (string *)&this->localControlChannel;
  local_58 = &(this->localControlChannel).field_2;
  (this->localControlChannel)._M_dataplus._M_p = (pointer)local_58;
  (this->localControlChannel)._M_string_length = 0;
  (this->localControlChannel).field_2._M_local_buf[0] = '\0';
  local_48 = (string *)&this->controlResponseChannel;
  local_60 = &(this->controlResponseChannel).field_2;
  (this->controlResponseChannel)._M_dataplus._M_p = (pointer)local_60;
  (this->controlResponseChannel)._M_string_length = 0;
  (this->controlResponseChannel).field_2._M_local_buf[0] = '\0';
  (this->recordingEventsChannel)._M_dataplus._M_p = (pointer)&(this->recordingEventsChannel).field_2
  ;
  (this->recordingEventsChannel)._M_string_length = 0;
  (this->recordingEventsChannel).field_2._M_local_buf[0] = '\0';
  pptVar5 = (type_info_t **)getenv("AERON_ARCHIVE_MESSAGE_TIMEOUT");
  if (pptVar5 == (type_info_t **)0x0) {
    ptVar7 = (type_info_t *)0x12a05f200;
  }
  else {
    local_88 = (type_info_t *)0x0;
    sVar6 = strlen((char *)pptVar5);
    local_80.source = (type_info_t *)((long)pptVar5 + sVar6);
    local_80._0_8_ = pptVar5;
    bVar2 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_signed<long>((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)&local_80
                             ,(long *)&local_88);
    ptVar7 = local_88;
    if (!bVar2) {
      local_80._0_8_ = &PTR__bad_cast_00162cb8;
      local_80.source = (type_info_t *)&char*::typeinfo;
      local_80.target = (type_info_t *)&long::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>(&local_80);
    }
  }
  this->messageTimeoutNs = (int64_t)ptVar7;
  pcVar8 = getenv("AERON_ARCHIVE_CONTROL_CHANNEL");
  ppptVar1 = (type_info_t ***)&local_80.target;
  local_80._0_8_ = ppptVar1;
  if (pcVar8 == (char *)0x0) {
    local_88 = (type_info_t *)0x21;
    local_80._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_88);
    local_80.target = local_88;
    *(undefined8 *)(local_80._0_8_ + 0x10) = 0x6c61636f6c3d746e;
    *(undefined8 *)(local_80._0_8_ + 0x18) = 0x3130383a74736f68;
    *(undefined8 *)local_80._0_8_ = 0x64753a6e6f726561;
    *(undefined8 *)(local_80._0_8_ + 8) = 0x696f70646e653f70;
    *(char *)(local_80._0_8_ + 0x20) = '0';
    local_80.source = local_88;
    *(type_info_t *)(local_80._0_8_ + (long)local_88) = (type_info_t)0x0;
  }
  else {
    local_80.source = (type_info_t *)0x0;
    local_80.target = (type_info_t *)((ulong)local_80.target & 0xffffffffffffff00);
    strlen(pcVar8);
    std::__cxx11::string::_M_replace((ulong)&local_80,0,(char *)0x0,(ulong)pcVar8);
  }
  std::__cxx11::string::operator=(local_38,(string *)&local_80);
  if ((type_info_t ***)local_80._0_8_ != ppptVar1) {
    operator_delete((void *)local_80._0_8_,(ulong)(local_80.target + 1));
  }
  pptVar5 = (type_info_t **)getenv("AERON_ARCHIVE_CONTROL_STREAM_ID");
  if (pptVar5 == (type_info_t **)0x0) {
    iVar4 = 10;
  }
  else {
    local_88 = (type_info_t *)((ulong)local_88 & 0xffffffff00000000);
    sVar6 = strlen((char *)pptVar5);
    local_80.source = (type_info_t *)((long)pptVar5 + sVar6);
    local_80._0_8_ = pptVar5;
    bVar2 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_signed<int>((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)&local_80,
                            (int *)&local_88);
    if (!bVar2) {
      local_80._0_8_ = &PTR__bad_cast_00162cb8;
      local_80.source = (type_info_t *)&char*::typeinfo;
      local_80.target = (type_info_t *)&int::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>(&local_80);
    }
    iVar4 = (int32_t)local_88;
  }
  this->controlStreamId = iVar4;
  pcVar8 = getenv("AERON_ARCHIVE_LOCAL_CONTROL_CHANNEL");
  if (pcVar8 == (char *)0x0) {
    local_80.target = (type_info_t *)0x70693a6e6f726561;
    local_68 = 99;
    local_80.source = (type_info_t *)0x9;
    local_67 = 0;
    local_80._0_8_ = ppptVar1;
  }
  else {
    local_80.source = (type_info_t *)0x0;
    local_80.target = (type_info_t *)((ulong)local_80.target & 0xffffffffffffff00);
    local_80._0_8_ = ppptVar1;
    strlen(pcVar8);
    std::__cxx11::string::_M_replace((ulong)&local_80,0,(char *)0x0,(ulong)pcVar8);
  }
  std::__cxx11::string::operator=(local_40,(string *)&local_80);
  if ((type_info_t ***)local_80._0_8_ != ppptVar1) {
    operator_delete((void *)local_80._0_8_,(ulong)(local_80.target + 1));
  }
  pptVar5 = (type_info_t **)getenv("AERON_ARCHIVE_LOCAL_CONTROL_STREAM_ID");
  if (pptVar5 == (type_info_t **)0x0) {
    iVar4 = 0xb;
  }
  else {
    local_88 = (type_info_t *)((ulong)local_88 & 0xffffffff00000000);
    sVar6 = strlen((char *)pptVar5);
    local_80.source = (type_info_t *)((long)pptVar5 + sVar6);
    local_80._0_8_ = pptVar5;
    bVar2 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_signed<int>((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)&local_80,
                            (int *)&local_88);
    if (!bVar2) {
      local_80._0_8_ = &PTR__bad_cast_00162cb8;
      local_80.source = (type_info_t *)&char*::typeinfo;
      local_80.target = (type_info_t *)&int::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>(&local_80);
    }
    iVar4 = (int32_t)local_88;
  }
  this->localControlStreamId = iVar4;
  pcVar8 = getenv("AERON_ARCHIVE_CONTROL_RESPONSE_CHANNEL");
  if (pcVar8 == (char *)0x0) {
    local_88 = (type_info_t *)0x21;
    local_80._0_8_ = ppptVar1;
    local_80._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_88);
    local_80.target = local_88;
    *(undefined8 *)(local_80._0_8_ + 0x10) = 0x6c61636f6c3d746e;
    *(undefined8 *)(local_80._0_8_ + 0x18) = 0x3230383a74736f68;
    *(undefined8 *)local_80._0_8_ = 0x64753a6e6f726561;
    *(undefined8 *)(local_80._0_8_ + 8) = 0x696f70646e653f70;
    *(char *)(local_80._0_8_ + 0x20) = '0';
    local_80.source = local_88;
    *(type_info_t *)(local_80._0_8_ + (long)local_88) = (type_info_t)0x0;
  }
  else {
    local_80.source = (type_info_t *)0x0;
    local_80.target = (type_info_t *)((ulong)local_80.target & 0xffffffffffffff00);
    local_80._0_8_ = ppptVar1;
    strlen(pcVar8);
    std::__cxx11::string::_M_replace((ulong)&local_80,0,(char *)0x0,(ulong)pcVar8);
  }
  std::__cxx11::string::operator=(local_48,(string *)&local_80);
  if ((type_info_t ***)local_80._0_8_ != ppptVar1) {
    operator_delete((void *)local_80._0_8_,(ulong)(local_80.target + 1));
  }
  pptVar5 = (type_info_t **)getenv("AERON_ARCHIVE_CONTROL_RESPONSE_STREAM_ID");
  if (pptVar5 == (type_info_t **)0x0) {
    iVar4 = 0x14;
  }
  else {
    local_88 = (type_info_t *)((ulong)local_88 & 0xffffffff00000000);
    sVar6 = strlen((char *)pptVar5);
    local_80.source = (type_info_t *)((long)pptVar5 + sVar6);
    local_80._0_8_ = pptVar5;
    bVar2 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_signed<int>((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)&local_80,
                            (int *)&local_88);
    if (!bVar2) {
      local_80._0_8_ = &PTR__bad_cast_00162cb8;
      local_80.source = (type_info_t *)&char*::typeinfo;
      local_80.target = (type_info_t *)&int::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>(&local_80);
    }
    iVar4 = (int32_t)local_88;
  }
  this->controlResponseStreamId = iVar4;
  pcVar8 = getenv("AERON_ARCHIVE_RECORDING_EVENTS_CHANNEL");
  if (pcVar8 == (char *)0x0) {
    local_88 = (type_info_t *)0x21;
    local_80._0_8_ = ppptVar1;
    local_80._0_8_ = std::__cxx11::string::_M_create((ulong *)&local_80,(ulong)&local_88);
    local_80.target = local_88;
    *(undefined8 *)(local_80._0_8_ + 0x10) = 0x6c61636f6c3d746e;
    *(undefined8 *)(local_80._0_8_ + 0x18) = 0x3330383a74736f68;
    *(undefined8 *)local_80._0_8_ = 0x64753a6e6f726561;
    *(undefined8 *)(local_80._0_8_ + 8) = 0x696f70646e653f70;
    *(char *)(local_80._0_8_ + 0x20) = '0';
    local_80.source = local_88;
    *(type_info_t *)(local_80._0_8_ + (long)local_88) = (type_info_t)0x0;
  }
  else {
    local_80.source = (type_info_t *)0x0;
    local_80.target = (type_info_t *)((ulong)local_80.target & 0xffffffffffffff00);
    local_80._0_8_ = ppptVar1;
    strlen(pcVar8);
    std::__cxx11::string::_M_replace((ulong)&local_80,0,(char *)0x0,(ulong)pcVar8);
  }
  std::__cxx11::string::operator=((string *)&this->recordingEventsChannel,(string *)&local_80);
  if ((type_info_t ***)local_80._0_8_ != ppptVar1) {
    operator_delete((void *)local_80._0_8_,(ulong)(local_80.target + 1));
  }
  pptVar5 = (type_info_t **)getenv("AERON_ARCHIVE_RECORDING_EVENTS_STREAM_ID");
  if (pptVar5 == (type_info_t **)0x0) {
    iVar4 = 0x1e;
  }
  else {
    local_88 = (type_info_t *)((ulong)local_88 & 0xffffffff00000000);
    sVar6 = strlen((char *)pptVar5);
    local_80.source = (type_info_t *)((long)pptVar5 + sVar6);
    local_80._0_8_ = pptVar5;
    bVar2 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_signed<int>((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)&local_80,
                            (int *)&local_88);
    if (!bVar2) {
      local_80._0_8_ = &PTR__bad_cast_00162cb8;
      local_80.source = (type_info_t *)&char*::typeinfo;
      local_80.target = (type_info_t *)&int::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>(&local_80);
    }
    iVar4 = (int32_t)local_88;
  }
  this->recordingEventsStreamId = iVar4;
  pptVar5 = (type_info_t **)getenv("AERON_ARCHIVE_CONTROL_TERM_BUFFER_SPARSE");
  if (pptVar5 == (type_info_t **)0x0) {
    uVar3 = true;
  }
  else {
    local_88 = (type_info_t *)((ulong)local_88 & 0xffffffffffffff00);
    sVar6 = strlen((char *)pptVar5);
    local_80.source = (type_info_t *)((long)pptVar5 + sVar6);
    local_80._0_8_ = pptVar5;
    bVar2 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::operator>>
                      ((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)&local_80,
                       (bool *)&local_88);
    if (!bVar2) {
      local_80._0_8_ = &PTR__bad_cast_00162cb8;
      local_80.source = (type_info_t *)&char*::typeinfo;
      local_80.target = (type_info_t *)&bool::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>(&local_80);
    }
    uVar3 = local_88._0_1_;
  }
  this->controlTermBufferSparse = (bool)uVar3;
  pptVar5 = (type_info_t **)getenv("AERON_ARCHIVE_CONTROL_TERM_BUFFER_LENGTH");
  if (pptVar5 == (type_info_t **)0x0) {
    iVar4 = 0x10000;
  }
  else {
    local_88 = (type_info_t *)((ulong)local_88 & 0xffffffff00000000);
    sVar6 = strlen((char *)pptVar5);
    local_80.source = (type_info_t *)((long)pptVar5 + sVar6);
    local_80._0_8_ = pptVar5;
    bVar2 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_signed<int>((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)&local_80,
                            (int *)&local_88);
    if (!bVar2) {
      local_80._0_8_ = &PTR__bad_cast_00162cb8;
      local_80.source = (type_info_t *)&char*::typeinfo;
      local_80.target = (type_info_t *)&int::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>(&local_80);
    }
    iVar4 = (int32_t)local_88;
  }
  this->controlTermBufferLength = iVar4;
  pptVar5 = (type_info_t **)getenv("AERON_ARCHIVE_CONTROL_MTU_LENGTH");
  if (pptVar5 == (type_info_t **)0x0) {
    local_88._0_4_ = 0x580;
  }
  else {
    local_88 = (type_info_t *)((ulong)local_88 & 0xffffffff00000000);
    sVar6 = strlen((char *)pptVar5);
    local_80.source = (type_info_t *)((long)pptVar5 + sVar6);
    local_80._0_8_ = pptVar5;
    bVar2 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
            shr_signed<int>((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)&local_80,
                            (int *)&local_88);
    if (!bVar2) {
      local_80._0_8_ = &PTR__bad_cast_00162cb8;
      local_80.source = (type_info_t *)&char*::typeinfo;
      local_80.target = (type_info_t *)&int::typeinfo;
      boost::throw_exception<boost::bad_lexical_cast>(&local_80);
    }
  }
  this->controlMtuLength = (int32_t)local_88;
  return;
}

Assistant:

Configuration::Configuration() {
    messageTimeoutNs = getMessageTimeout();
    controlChannel = getControlChannel();
    controlStreamId = getControlStreamId();
    localControlChannel = getLocalControlChannel();
    localControlStreamId = getLocalControlStreamId();
    controlResponseChannel = getControlResponseChannel();
    controlResponseStreamId = getControlResponseStreamId();
    recordingEventsChannel = getRecordingEventsChannel();
    recordingEventsStreamId = getRecordingEventsStreamId();
    controlTermBufferSparse = getControlTermBufferSparse();
    controlTermBufferLength = getControlTermBufferLength();
    controlMtuLength = getControlMtuLength();
}